

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataModel.cpp
# Opt level: O0

DataAddress * Rml::ParseAddress(DataAddress *__return_storage_ptr__,String *address_str)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  ulong uVar5;
  String local_d8;
  int local_b4;
  long lStack_b0;
  int index;
  size_t i_close;
  long local_88;
  size_t i_open;
  reference local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *item;
  iterator __end1;
  iterator __begin1;
  StringList *__range1;
  DataAddress address;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30 [8];
  StringList list;
  String *address_str_local;
  
  list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = address_str;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(local_30);
  StringUtilities::ExpandString
            ((StringList *)local_30,
             list.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,'.');
  ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::vector
            ((vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *)&__range1);
  sVar4 = ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_30);
  ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::reserve
            ((vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *)&__range1,
             sVar4 * 2);
  __end1 = ::std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(local_30);
  item = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ::std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(local_30);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&item), bVar2) {
    local_78 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
    uVar5 = ::std::__cxx11::string::empty();
    if ((uVar5 & 1) != 0) {
      memset(__return_storage_ptr__,0,0x18);
      ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::vector
                (__return_storage_ptr__);
      goto LAB_004fa84e;
    }
    local_88 = ::std::__cxx11::string::find((char)local_78,0x5b);
    if (local_88 == 0) {
      memset(__return_storage_ptr__,0,0x18);
      ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::vector
                (__return_storage_ptr__);
      goto LAB_004fa84e;
    }
    ::std::__cxx11::string::substr((ulong)&i_close,(ulong)local_78);
    ::std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>::
    emplace_back<std::__cxx11::string>
              ((vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>> *)&__range1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_close);
    ::std::__cxx11::string::~string((string *)&i_close);
    while (local_88 != -1) {
      lStack_b0 = ::std::__cxx11::string::find((char)local_78,0x5d);
      if (lStack_b0 == -1) {
        memset(__return_storage_ptr__,0,0x18);
        ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::vector
                  (__return_storage_ptr__);
        goto LAB_004fa84e;
      }
      ::std::__cxx11::string::substr((ulong)&local_d8,(ulong)local_78);
      iVar3 = FromString<int>(&local_d8,-1);
      ::std::__cxx11::string::~string((string *)&local_d8);
      local_b4 = iVar3;
      if (iVar3 < 0) {
        memset(__return_storage_ptr__,0,0x18);
        ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::vector
                  (__return_storage_ptr__);
        goto LAB_004fa84e;
      }
      ::std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>::emplace_back<int&>
                ((vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>> *)&__range1,
                 &local_b4);
      local_88 = ::std::__cxx11::string::find((char)local_78,0x5b);
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  bVar2 = ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::empty
                    ((vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *)
                     &__range1);
  if (!bVar2) {
    ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::operator[]
              ((vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *)&__range1,0)
    ;
    uVar5 = ::std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) goto LAB_004fa837;
  }
  bVar2 = Assert("RMLUI_ASSERT(!address.empty() && !address[0].name.empty())",
                 "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataModel.cpp"
                 ,0x49);
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
LAB_004fa837:
  ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::vector
            (__return_storage_ptr__,
             (vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *)&__range1);
LAB_004fa84e:
  i_open._4_4_ = 1;
  ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::~vector
            ((vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *)&__range1);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_30);
  return __return_storage_ptr__;
}

Assistant:

static DataAddress ParseAddress(const String& address_str)
{
	StringList list;
	StringUtilities::ExpandString(list, address_str, '.');

	DataAddress address;
	address.reserve(list.size() * 2);

	for (const auto& item : list)
	{
		if (item.empty())
			return DataAddress();

		size_t i_open = item.find('[', 0);
		if (i_open == 0)
			return DataAddress();

		address.emplace_back(item.substr(0, i_open));

		while (i_open != String::npos)
		{
			size_t i_close = item.find(']', i_open + 1);
			if (i_close == String::npos)
				return DataAddress();

			int index = FromString<int>(item.substr(i_open + 1, i_close - i_open), -1);
			if (index < 0)
				return DataAddress();

			address.emplace_back(index);

			i_open = item.find('[', i_close + 1);
		}
		// TODO: Abort on invalid characters among [ ] and after the last found bracket?
	}

	RMLUI_ASSERT(!address.empty() && !address[0].name.empty());

	return address;
}